

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall TArray<GLFlat,_GLFlat>::Grow(TArray<GLFlat,_GLFlat> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  GLFlat *pGVar3;
  uint uVar4;
  
  uVar4 = amount + this->Count;
  uVar1 = this->Most;
  if (uVar1 < uVar4) {
    uVar2 = 0x10;
    if (0xf < uVar1) {
      uVar2 = (uVar1 >> 1) + uVar1;
    }
    if (uVar2 < uVar4) {
      uVar2 = uVar4;
    }
    this->Most = uVar2;
    pGVar3 = (GLFlat *)
             M_Realloc_Dbg(this->Array,(ulong)uVar2 * 0x88,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                           ,0x1ad);
    this->Array = pGVar3;
  }
  return;
}

Assistant:

void Grow (unsigned int amount)
	{
		if (Count + amount > Most)
		{
			const unsigned int choicea = Count + amount;
			const unsigned int choiceb = Most = (Most >= 16) ? Most + Most / 2 : 16;
			Most = (choicea > choiceb ? choicea : choiceb);
			DoResize ();
		}
	}